

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.hpp
# Opt level: O0

pair<unsigned_long,_bool>
detail::
do_try_get_deserialized_size<std::tuple<std::pair<person,person>,std::vector<person,std::allocator<person>>,std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>>>
          (undefined8 param_1,byte *param_2)

{
  type tVar1;
  pair<unsigned_long,_bool> pVar2;
  tuple<type_tag<std::pair<person,_person>_>,_type_tag<std::vector<person,_std::allocator<person>_>_>,_type_tag<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>_>
  local_39;
  anon_class_8_1_4eff857e local_38 [2];
  undefined1 local_28 [8];
  span<const_std::byte> buffer_local;
  
  local_38[0].buffer = (span<const_std::byte> *)local_28;
  local_28 = (undefined1  [8])param_1;
  buffer_local.begin_ = param_2;
  std::
  tuple<type_tag<std::pair<person,_person>_>,_type_tag<std::vector<person,_std::allocator<person>_>_>,_type_tag<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>_>
  ::tuple<void,_true>(&local_39);
  tVar1 = std::
          apply<detail::do_try_get_deserialized_size<std::tuple<std::pair<person,person>,std::vector<person,std::allocator<person>>,std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>>>(span<std::byte_const>,value_tag<(serialization_category)6>)::_lambda((auto:1)___)_1_,std::tuple<type_tag<std::pair<person,person>>,type_tag<std::vector<person,std::allocator<person>>>,type_tag<std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>>>>
                    (local_38,&local_39);
  pVar2.first = tVar1.first;
  pVar2.second = tVar1.second;
  pVar2._9_7_ = tVar1._9_7_;
  return pVar2;
}

Assistant:

std::pair<size_t, bool> do_try_get_deserialized_size(span<std::byte const> buffer, value_tag<serialization_category::tuple>) noexcept {
        return std::apply([&] (auto...tags) {
            auto const data_begin = buffer.begin();
            auto const try_one    = [&] (auto tag) {
                using value_type = remove_deep_constness_t<typename decltype(tag)::type>;
                auto const [size, success] = try_get_deserialized_size<value_type>(buffer);
                if (!success) return false;
                buffer.begin() += size;
                return true;
            };
            auto const success = (try_one(tags) && ...);
            return std::pair<size_t, bool>{ buffer.begin() - data_begin, success };
        }, map_tuple_types_t<T, tag_type>{});
    }